

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textlabel.cpp
# Opt level: O2

void __thiscall
QtMWidgets::TextLabel::TextLabel(TextLabel *this,QString *text,QWidget *parent,WindowFlags f)

{
  TextLabelPrivate *this_00;
  TextLabel *ctx;
  
  QFrame::QFrame(&this->super_QFrame,parent,f.i);
  *(undefined ***)this = &PTR_metaObject_001a9c28;
  *(undefined ***)&this->field_0x10 = &PTR__TextLabel_001a9de0;
  this_00 = (TextLabelPrivate *)operator_new(0x28);
  ctx = this;
  TextLabelPrivate::TextLabelPrivate(this_00,this);
  (this->d).d = this_00;
  TextLabelPrivate::init(this_00,(EVP_PKEY_CTX *)ctx);
  setText(this,text);
  return;
}

Assistant:

TextLabel::TextLabel( const QString & text,
	QWidget * parent, Qt::WindowFlags f )
	:	QFrame( parent, f )
	,	d( new TextLabelPrivate( this ) )
{
	d->init();
	setText( text );
}